

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O2

void __thiscall
calc4::anon_unknown_23::PrecomputeVisitor<__int128>::Visit
          (PrecomputeVisitor<__int128> *this,shared_ptr<const_calc4::ConditionalOperator> *op)

{
  bool bVar1;
  PrecomputeVisitor<__int128> *pPVar2;
  shared_ptr<const_calc4::Operator> sVar3;
  shared_ptr<const_calc4::Operator> condition;
  shared_ptr<const_calc4::Operator> ifFalse;
  shared_ptr<const_calc4::Operator> ifTrue;
  __int128 conditionValue;
  undefined1 auStack_68 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  PrecomputeVisitor<__int128> local_48;
  __shared_ptr<const_calc4::ConditionalOperator,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  Precompute((PrecomputeVisitor<__int128> *)auStack_68,(shared_ptr<const_calc4::Operator> *)this);
  Precompute(&local_48,(shared_ptr<const_calc4::Operator> *)this);
  sVar3 = Precompute((PrecomputeVisitor<__int128> *)(auStack_68 + 0x10),
                     (shared_ptr<const_calc4::Operator> *)this);
  bVar1 = TryGetPrecomputedValue
                    ((PrecomputeVisitor<__int128> *)auStack_68,&local_48.value,
                     (__int128 *)
                     sVar3.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._M_pi);
  if (bVar1) {
    pPVar2 = &local_48;
    if (local_48.value.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0 &&
        local_48.value.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pPVar2 = (PrecomputeVisitor<__int128> *)(auStack_68 + 0x10);
    }
    std::__shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2> *)pPVar2);
  }
  else {
    ConditionalOperator::Create
              ((shared_ptr<const_calc4::Operator> *)&local_28,
               (shared_ptr<const_calc4::Operator> *)auStack_68,
               (shared_ptr<const_calc4::Operator> *)&local_48);
    std::__shared_ptr<calc4::Operator_const,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<calc4::Operator_const,(__gnu_cxx::_Lock_policy)2> *)&this->value,
               &local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48.context);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_68 + 8));
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const ConditionalOperator>& op) override
    {
        std::shared_ptr<const Operator> condition = Precompute(op->GetCondition());
        std::shared_ptr<const Operator> ifTrue = Precompute(op->GetIfTrue());
        std::shared_ptr<const Operator> ifFalse = Precompute(op->GetIfFalse());

        TNumber conditionValue;
        if (TryGetPrecomputedValue(condition, &conditionValue))
        {
            value = conditionValue != 0 ? ifTrue : ifFalse;
        }
        else
        {
            value = ConditionalOperator::Create(condition, ifTrue, ifFalse);
        }
    }